

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intceil.hpp
# Opt level: O1

unsigned_long burst::intceil<unsigned_long,int>(Integer<unsigned_long> n,Integer<int> factor)

{
  long lVar1;
  domain_error *this;
  
  if (0 < factor) {
    if (n == 0) {
      lVar1 = 0;
    }
    else {
      lVar1 = (n - 1) / (ulong)(uint)factor + 1;
    }
    return (ulong)(uint)factor * lVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_3d11fb);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr I intceil (Integer<I> n, Integer<J> factor)
    {
        if (factor > 0)
        {
            return detail::intceil_impl(n, factor);
        }
        else
        {
            throw std::domain_error("Ближайшее кратное относительно неположительного делителя не определено.");
        }
    }